

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O1

void __thiscall Gb_Square::reset(Gb_Square *this)

{
  this->phase = 0;
  this->sweep_delay = 0;
  this->sweep_freq = 0;
  (this->super_Gb_Env).env_delay = 0;
  (this->super_Gb_Env).super_Gb_Osc.delay = 0;
  (this->super_Gb_Env).super_Gb_Osc.last_amp = 0;
  (this->super_Gb_Env).super_Gb_Osc.length = 0;
  (this->super_Gb_Env).super_Gb_Osc.output_select = 3;
  (this->super_Gb_Env).super_Gb_Osc.output = (this->super_Gb_Env).super_Gb_Osc.outputs[3];
  return;
}

Assistant:

void Gb_Square::reset()
{
	phase = 0;
	sweep_freq = 0;
	sweep_delay = 0;
	Gb_Env::reset();
}